

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

iterator * __thiscall Catch::TextFlow::Columns::iterator::operator++(iterator *this)

{
  bool bVar1;
  const_iterator *pcVar2;
  reference other;
  iterator *in_RDI;
  const_iterator *in_stack_00000010;
  size_t i;
  const_iterator *this_00;
  const_iterator *local_10;
  
  local_10 = (const_iterator *)0x0;
  while (this_00 = local_10,
        pcVar2 = (const_iterator *)
                 std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
                 size(in_RDI->m_columns), this_00 < pcVar2) {
    other = std::
            vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
            ::operator[](&in_RDI->m_iterators,(size_type)local_10);
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::operator[]
              (in_RDI->m_columns,(size_type)local_10);
    Column::end((Column *)this_00);
    bVar1 = Column::const_iterator::operator!=(this_00,other);
    if (bVar1) {
      std::
      vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
      ::operator[](&in_RDI->m_iterators,(size_type)local_10);
      Column::const_iterator::operator++(in_stack_00000010);
    }
    local_10 = (const_iterator *)&(((AnsiSkippingString *)&local_10->m_column)->m_string).field_0x1;
  }
  return in_RDI;
}

Assistant:

Columns::iterator& Columns::iterator::operator++() {
            for ( size_t i = 0; i < m_columns.size(); ++i ) {
                if ( m_iterators[i] != m_columns[i].end() ) {
                    ++m_iterators[i];
                }
            }
            return *this;
        }